

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O3

void test::test_generate_export_import_and_sign_invoker(void)

{
  unit_test_log_t *puVar1;
  ios_base *this;
  string local_288;
  undefined7 uStack_287;
  undefined1 local_278 [16];
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  ostringstream local_218 [112];
  ios_base local_1a8 [264];
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_220 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"test_generate_export_import_and_sign",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_40 = local_a0;
  local_38 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_228,0x6a);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_230 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"test_generate_export_import_and_sign",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_50 = local_a0;
  local_48 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_238,0x6a);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_240 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"test_generate_export_import_and_sign",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_60 = local_a0;
  local_58 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_248,0x6a);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  this = local_1a8;
  std::ios_base::~ios_base(this);
  test_generate_export_import_and_sign::test_method((test_generate_export_import_and_sign *)this);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_250 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"test_generate_export_import_and_sign",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_70 = local_a0;
  local_68 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_258,0x6a);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_260 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90[0] = 0;
  local_288 = (string)0x22;
  local_a0 = local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"test_generate_export_import_and_sign",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((undefined1 *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((undefined1 *)CONCAT71(uStack_287,local_288));
  }
  local_80 = local_a0;
  local_78 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_268,0x6a);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_generate_export_import_and_sign) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	crypto->generateKeyPair();
	const string pk = crypto->exportPrivateKey();
	crypto->loadPrivateKey(pk);
	const string signature = crypto->signString("testString");
	//(1024/8)*(4/3)+4 (base64)
	BOOST_CHECK_MESSAGE(signature.size() == 172, "signature is the right size");
	crypto.release();
}